

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Operator_Matches::is_match(Operator_Matches *this,size_t t_group,string_view t_str)

{
  Static_String *pSVar1;
  Operator_Matches *pOVar2;
  Operator_Matches *pOVar3;
  bool bVar4;
  size_t local_20;
  char *local_18;
  
  local_18 = t_str._M_str;
  local_20 = t_str._M_len;
  switch(t_group) {
  case 0:
    pSVar1 = std::operator()(this,&this->m_1,&local_20);
    bVar4 = pSVar1 == (this->m_1)._M_elems;
    goto LAB_0046bcfb;
  case 1:
    pOVar3 = (Operator_Matches *)&this->m_2;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_1,pOVar3,&local_20);
    break;
  case 2:
    pOVar3 = (Operator_Matches *)&this->m_3;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_2,pOVar3,&local_20);
    break;
  case 3:
    pOVar3 = (Operator_Matches *)&this->m_4;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_3,pOVar3,&local_20);
    break;
  case 4:
    pOVar3 = (Operator_Matches *)&this->m_5;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_4,pOVar3,&local_20);
    break;
  case 5:
    pOVar3 = (Operator_Matches *)&this->m_6;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_5,pOVar3,&local_20);
    break;
  case 6:
    pOVar3 = (Operator_Matches *)&this->m_7;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_6,pOVar3,&local_20);
    break;
  case 7:
    pOVar3 = (Operator_Matches *)&this->m_8;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_7,pOVar3,&local_20);
    break;
  case 8:
    pOVar3 = (Operator_Matches *)&this->m_9;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_8,pOVar3,&local_20);
    break;
  case 9:
    pOVar3 = (Operator_Matches *)&this->m_10;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_9,pOVar3,&local_20);
    break;
  case 10:
    pOVar3 = (Operator_Matches *)&this->m_11;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_10,pOVar3,&local_20);
    break;
  case 0xb:
    pOVar3 = this + 1;
    pOVar2 = (Operator_Matches *)std::operator()(&this->m_11,pOVar3,&local_20);
    break;
  default:
    return false;
  }
  bVar4 = pOVar2 == pOVar3;
LAB_0046bcfb:
  return !bVar4;
}

Assistant:

constexpr bool is_match(const std::size_t t_group, std::string_view t_str) const noexcept {
          auto match = [&t_str](const auto &array) {
            return std::any_of(array.begin(), array.end(), [&t_str](const auto &v) { return v == t_str; });
          };

          switch (t_group) {
            case 0:
              return match(m_0);
            case 1:
              return match(m_1);
            case 2:
              return match(m_2);
            case 3:
              return match(m_3);
            case 4:
              return match(m_4);
            case 5:
              return match(m_5);
            case 6:
              return match(m_6);
            case 7:
              return match(m_7);
            case 8:
              return match(m_8);
            case 9:
              return match(m_9);
            case 10:
              return match(m_10);
            case 11:
              return match(m_11);
            default:
              return false;
          }
        }